

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void * vdbeSorterRowkey(VdbeSorter *pSorter,int *pnKey)

{
  int iVar1;
  PmaReader *pPVar2;
  SorterRecord *pSVar3;
  SorterRecord *pSVar4;
  
  if (pSorter->bUsePMA == '\0') {
    pSVar4 = (pSorter->list).pList;
    pSVar3 = pSVar4 + 1;
  }
  else {
    pPVar2 = pSorter->pMerger->aReadr;
    iVar1 = pSorter->pMerger->aTree[1];
    pSVar4 = (SorterRecord *)&pPVar2[iVar1].nKey;
    pSVar3 = (SorterRecord *)pPVar2[iVar1].aKey;
  }
  *pnKey = pSVar4->nVal;
  return pSVar3;
}

Assistant:

static void *vdbeSorterRowkey(
  const VdbeSorter *pSorter,      /* Sorter object */
  int *pnKey                      /* OUT: Size of current key in bytes */
){
  void *pKey;
  if( pSorter->bUsePMA ){
    PmaReader *pReader;
#if SQLITE_MAX_WORKER_THREADS>0
    if( pSorter->bUseThreads ){
      pReader = pSorter->pReader;
    }else
#endif
    /*if( !pSorter->bUseThreads )*/{
      pReader = &pSorter->pMerger->aReadr[pSorter->pMerger->aTree[1]];
    }
    *pnKey = pReader->nKey;
    pKey = pReader->aKey;
  }else{
    *pnKey = pSorter->list.pList->nVal;
    pKey = SRVAL(pSorter->list.pList);
  }
  return pKey;
}